

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O1

bool __thiscall
cmCommandArgumentParserHelper::HandleEscapeSymbol
          (cmCommandArgumentParserHelper *this,ParserType *pt,char symbol)

{
  int iVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  char *str;
  ostringstream e;
  char local_1b1;
  char local_1b0;
  undefined7 uStack_1af;
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  iVar1 = (int)CONCAT71(in_register_00000011,symbol);
  local_1b1 = symbol;
  if (iVar1 < 0x6e) {
    uVar2 = (ulong)(iVar1 - 0x20U);
    if (0x3e < iVar1 - 0x20U) {
LAB_002c7ecd:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"Invalid escape sequence \\",0x19);
      local_1b0 = symbol;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,&local_1b0,1);
      std::__cxx11::stringbuf::str();
      if ((this->ErrorString)._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&this->ErrorString);
      }
      if ((long *)CONCAT71(uStack_1af,local_1b0) != local_1a0) {
        operator_delete((long *)CONCAT71(uStack_1af,local_1b0),local_1a0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
      std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
      return false;
    }
    if ((0x500000010000031dU >> (uVar2 & 0x3f) & 1) == 0) {
      if (uVar2 != 0x10) {
        if (uVar2 != 0x1b) goto LAB_002c7ecd;
        str = "\\;";
        iVar1 = 2;
        goto LAB_002c7e6a;
      }
      str = "";
    }
    else {
      str = &local_1b1;
    }
  }
  else if (iVar1 == 0x6e) {
    str = "\n";
  }
  else if (iVar1 == 0x72) {
    str = "\r";
  }
  else {
    if (iVar1 != 0x74) goto LAB_002c7ecd;
    str = "\t";
  }
  iVar1 = 1;
LAB_002c7e6a:
  AllocateParserType(this,pt,str,iVar1);
  return true;
}

Assistant:

bool cmCommandArgumentParserHelper::HandleEscapeSymbol(
  cmCommandArgumentParserHelper::ParserType* pt, char symbol)
{
  switch (symbol) {
    case '\\':
    case '"':
    case ' ':
    case '#':
    case '(':
    case ')':
    case '$':
    case '@':
    case '^':
      this->AllocateParserType(pt, &symbol, 1);
      break;
    case ';':
      this->AllocateParserType(pt, "\\;", 2);
      break;
    case 't':
      this->AllocateParserType(pt, "\t", 1);
      break;
    case 'n':
      this->AllocateParserType(pt, "\n", 1);
      break;
    case 'r':
      this->AllocateParserType(pt, "\r", 1);
      break;
    case '0':
      this->AllocateParserType(pt, "\0", 1);
      break;
    default: {
      std::ostringstream e;
      e << "Invalid escape sequence \\" << symbol;
      this->SetError(e.str());
    }
      return false;
  }
  return true;
}